

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O2

void nn_ws_handshake_server_reply(nn_ws_handshake *self)

{
  int iVar1;
  size_t sVar2;
  char *__dest;
  char *pcVar3;
  undefined8 uVar4;
  char *pcVar5;
  char accept_key [29];
  nn_iovec response;
  
  pcVar3 = self->response;
  memset(pcVar3,0,0x200);
  switch(self->response_code) {
  case 0:
    iVar1 = nn_ws_handshake_hash_key(self->key,self->key_len,accept_key,0x1c709c);
    if (iVar1 < 0) {
      nn_backtrace_print();
      pcVar3 = "rc >= 0";
      uVar4 = 0x512;
      goto LAB_001b9507;
    }
    sVar2 = strlen(accept_key);
    if (sVar2 != 0x1c) {
      nn_backtrace_print();
      pcVar3 = "strlen (accept_key) == NN_WS_HANDSHAKE_ACCEPT_KEY_LEN";
      uVar4 = 0x514;
      goto LAB_001b9507;
    }
    __dest = (char *)nn_alloc_(self->protocol_len + 1);
    if (__dest != (char *)0x0) {
      strncpy(__dest,self->protocol,self->protocol_len);
      __dest[self->protocol_len] = '\0';
      sprintf(pcVar3,
              "HTTP/1.1 101 Switching Protocols\r\nUpgrade: websocket\r\nConnection: Upgrade\r\nSec-WebSocket-Accept: %s\r\nSec-WebSocket-Protocol: %s\r\n\r\n"
              ,accept_key,__dest);
      goto LAB_001b9452;
    }
    nn_backtrace_print();
    uVar4 = 0x517;
    goto LAB_001b94a8;
  case 1:
    pcVar5 = "400 Opening Handshake Too Long";
    break;
  default:
    nn_backtrace_print();
    pcVar3 = "0";
    uVar4 = 0x53c;
LAB_001b9507:
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/ws_handshake.c"
            ,uVar4);
    goto LAB_001b950e;
  case 3:
    pcVar5 = "400 Cannot Have Body";
    break;
  case 4:
    pcVar5 = "400 Unsupported WebSocket Version";
    break;
  case 5:
    pcVar5 = "400 Missing nanomsg Required Headers";
    break;
  case 6:
    pcVar5 = "400 Incompatible Socket Type";
    break;
  case 7:
    pcVar5 = "400 Unrecognized Socket Type";
  }
  __dest = (char *)nn_alloc_(self->version_len + 1);
  if (__dest != (char *)0x0) {
    strncpy(__dest,self->version,self->version_len);
    __dest[self->version_len] = '\0';
    sprintf(pcVar3,"HTTP/1.1 %s\r\nSec-WebSocket-Version: %s\r\n",pcVar5,__dest);
LAB_001b9452:
    nn_free(__dest);
    response.iov_len = strlen(pcVar3);
    response.iov_base = pcVar3;
    nn_usock_send(self->usock,&response,1);
    return;
  }
  nn_backtrace_print();
  uVar4 = 0x541;
LAB_001b94a8:
  fprintf(_stderr,"Out of memory (%s:%d)\n",
          "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/ws_handshake.c"
          ,uVar4);
LAB_001b950e:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_ws_handshake_server_reply (struct nn_ws_handshake *self)
{
    struct nn_iovec response;
    char *code;
    char *version;
    char *protocol;
    int rc;

    /*  Allow room for NULL terminator. */
    char accept_key [NN_WS_HANDSHAKE_ACCEPT_KEY_LEN + 1];

    memset (self->response, 0, sizeof (self->response));

    if (self->response_code == NN_WS_HANDSHAKE_RESPONSE_OK) {
        /*  Upgrade connection as per RFC 6455 section 4.2.2. */
        
        rc = nn_ws_handshake_hash_key (self->key, self->key_len,
            accept_key, sizeof (accept_key));
        nn_assert (rc >= 0);

        nn_assert (strlen (accept_key) == NN_WS_HANDSHAKE_ACCEPT_KEY_LEN);

        protocol = nn_alloc (self->protocol_len + 1, "WebSocket protocol");
        alloc_assert (protocol);
        strncpy (protocol, self->protocol, self->protocol_len);
        protocol [self->protocol_len] = '\0';

        sprintf (self->response,
            "HTTP/1.1 101 Switching Protocols\r\n"
            "Upgrade: websocket\r\n"
            "Connection: Upgrade\r\n"
            "Sec-WebSocket-Accept: %s\r\n"
            "Sec-WebSocket-Protocol: %s\r\n\r\n",
            accept_key, protocol);

        nn_free (protocol);
    }
    else {
        /*  Fail the connection with a helpful hint. */
        switch (self->response_code) {
        case NN_WS_HANDSHAKE_RESPONSE_TOO_BIG:
            code = "400 Opening Handshake Too Long";
            break;
        case NN_WS_HANDSHAKE_RESPONSE_WSPROTO:
            code = "400 Cannot Have Body";
            break;
        case NN_WS_HANDSHAKE_RESPONSE_WSVERSION:
            code = "400 Unsupported WebSocket Version";
            break;
        case NN_WS_HANDSHAKE_RESPONSE_NNPROTO:
            code = "400 Missing nanomsg Required Headers";
            break;
        case NN_WS_HANDSHAKE_RESPONSE_NOTPEER:
            code = "400 Incompatible Socket Type";
            break;
        case NN_WS_HANDSHAKE_RESPONSE_UNKNOWNTYPE:
            code = "400 Unrecognized Socket Type";
            break;
        default:
            /*  Unexpected failure response. */
            nn_assert (0);
            break;
        }

        version = nn_alloc (self->version_len + 1, "WebSocket version");
        alloc_assert (version);
        strncpy (version, self->version, self->version_len);
        version [self->version_len] = '\0';

        /*  Fail connection as per RFC 6455 4.4. */
        sprintf (self->response,
            "HTTP/1.1 %s\r\n"
            "Sec-WebSocket-Version: %s\r\n",
            code, version);

        nn_free (version);
    }

    response.iov_len = strlen (self->response);
    response.iov_base = &self->response;

    nn_usock_send (self->usock, &response, 1);

    return;
}